

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_read_mapbc_token(REF_DICT ref_dict,char *mapbc_filename,char *token)

{
  FILE *__s2;
  int iVar1;
  uint uVar2;
  size_t __n;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  char name [1024];
  REF_INT local_40;
  REF_INT local_3c;
  REF_INT type;
  REF_INT id;
  REF_INT n;
  REF_INT i;
  FILE *file;
  char *token_local;
  char *mapbc_filename_local;
  REF_DICT ref_dict_local;
  
  file = (FILE *)token;
  token_local = mapbc_filename;
  mapbc_filename_local = (char *)ref_dict;
  _n = fopen(mapbc_filename,"r");
  if (_n == (FILE *)0x0) {
    printf("unable to open %s\n",token_local);
  }
  if (_n == (FILE *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x1a9,
           "ref_phys_read_mapbc_token","unable to open file");
    ref_dict_local._4_4_ = 2;
  }
  else {
    iVar1 = __isoc99_fscanf(_n,"%d",&type);
    if (iVar1 == 1) {
      for (id = 0; id < type; id = id + 1) {
        iVar1 = __isoc99_fscanf(_n,"%d",&local_3c);
        if (iVar1 != 1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x1ac,"ref_phys_read_mapbc_token","read id");
          return 1;
        }
        iVar1 = __isoc99_fscanf(_n,"%d",&local_40);
        if (iVar1 != 1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x1ad,"ref_phys_read_mapbc_token","read type");
          return 1;
        }
        iVar1 = fgetc(_n);
        if ((long)iVar1 != 0x20) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x1ae,"ref_phys_read_mapbc_token","expected space",0x20,(long)iVar1);
          return 1;
        }
        fgets((char *)&ref_private_status_reis_ai,0x400,_n);
        __s2 = file;
        __n = strlen((char *)file);
        iVar1 = strncmp((char *)&ref_private_status_reis_ai,(char *)__s2,__n);
        if ((iVar1 == 0) &&
           (uVar2 = ref_dict_store((REF_DICT)mapbc_filename_local,local_3c,local_40), uVar2 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x1b2,"ref_phys_read_mapbc_token",(ulong)uVar2,"store");
          return uVar2;
        }
      }
      fclose(_n);
      ref_dict_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x1aa,
             "ref_phys_read_mapbc_token","number of lines");
      ref_dict_local._4_4_ = 1;
    }
  }
  return ref_dict_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_read_mapbc_token(REF_DICT ref_dict,
                                             const char *mapbc_filename,
                                             const char *token) {
  FILE *file;
  REF_INT i, n, id, type;
  char name[1024];
  file = fopen(mapbc_filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", mapbc_filename);
  RNS(file, "unable to open file");
  RES(1, fscanf(file, "%d", &n), "number of lines");
  for (i = 0; i < n; i++) {
    RES(1, fscanf(file, "%d", &id), "read id");
    RES(1, fscanf(file, "%d", &type), "read type");
    REIS(32, fgetc(file), "expected space");
    fgets(name, sizeof(name), file);
    /* printf(">%s<>%s<\n",name,token); */
    if (0 == strncmp(name, token, strlen(token))) {
      RSS(ref_dict_store(ref_dict, id, type), "store");
    }
  }
  fclose(file);
  return REF_SUCCESS;
}